

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O2

wchar_t archive_entry_set_digest(archive_entry *entry,wchar_t type,uchar *digest)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  
  switch(type) {
  case L'\x01':
    uVar1 = *(undefined8 *)(digest + 8);
    *(undefined8 *)(entry->digest).md5 = *(undefined8 *)digest;
    *(undefined8 *)((entry->digest).md5 + 8) = uVar1;
    break;
  case L'\x02':
    *(undefined4 *)((entry->digest).rmd160 + 0x10) = *(undefined4 *)(digest + 0x10);
    uVar1 = *(undefined8 *)(digest + 8);
    *(undefined8 *)(entry->digest).rmd160 = *(undefined8 *)digest;
    *(undefined8 *)((entry->digest).rmd160 + 8) = uVar1;
    break;
  case L'\x03':
    *(undefined4 *)((entry->digest).sha1 + 0x10) = *(undefined4 *)(digest + 0x10);
    uVar1 = *(undefined8 *)(digest + 8);
    *(undefined8 *)(entry->digest).sha1 = *(undefined8 *)digest;
    *(undefined8 *)((entry->digest).sha1 + 8) = uVar1;
    break;
  case L'\x04':
    uVar1 = *(undefined8 *)digest;
    uVar2 = *(undefined8 *)(digest + 8);
    uVar3 = *(undefined8 *)(digest + 0x18);
    *(undefined8 *)((entry->digest).sha256 + 0x10) = *(undefined8 *)(digest + 0x10);
    *(undefined8 *)((entry->digest).sha256 + 0x18) = uVar3;
    *(undefined8 *)(entry->digest).sha256 = uVar1;
    *(undefined8 *)((entry->digest).sha256 + 8) = uVar2;
    break;
  case L'\x05':
    uVar1 = *(undefined8 *)digest;
    uVar2 = *(undefined8 *)(digest + 8);
    uVar3 = *(undefined8 *)(digest + 0x10);
    uVar4 = *(undefined8 *)(digest + 0x18);
    uVar5 = *(undefined8 *)(digest + 0x28);
    *(undefined8 *)((entry->digest).sha384 + 0x20) = *(undefined8 *)(digest + 0x20);
    *(undefined8 *)((entry->digest).sha384 + 0x28) = uVar5;
    *(undefined8 *)((entry->digest).sha384 + 0x10) = uVar3;
    *(undefined8 *)((entry->digest).sha384 + 0x18) = uVar4;
    *(undefined8 *)(entry->digest).sha384 = uVar1;
    *(undefined8 *)((entry->digest).sha384 + 8) = uVar2;
    break;
  case L'\x06':
    uVar1 = *(undefined8 *)digest;
    uVar2 = *(undefined8 *)(digest + 8);
    uVar3 = *(undefined8 *)(digest + 0x10);
    uVar4 = *(undefined8 *)(digest + 0x18);
    uVar5 = *(undefined8 *)(digest + 0x20);
    uVar6 = *(undefined8 *)(digest + 0x28);
    uVar7 = *(undefined8 *)(digest + 0x38);
    *(undefined8 *)((entry->digest).sha512 + 0x30) = *(undefined8 *)(digest + 0x30);
    *(undefined8 *)((entry->digest).sha512 + 0x38) = uVar7;
    *(undefined8 *)((entry->digest).sha512 + 0x20) = uVar5;
    *(undefined8 *)((entry->digest).sha512 + 0x28) = uVar6;
    *(undefined8 *)((entry->digest).sha512 + 0x10) = uVar3;
    *(undefined8 *)((entry->digest).sha512 + 0x18) = uVar4;
    *(undefined8 *)(entry->digest).sha512 = uVar1;
    *(undefined8 *)((entry->digest).sha512 + 8) = uVar2;
    break;
  default:
    return L'\xffffffec';
  }
  return L'\0';
}

Assistant:

int
archive_entry_set_digest(struct archive_entry *entry, int type,
    const unsigned char *digest)
{
#define copy_digest(_e, _t, _d)\
	memcpy(_e->digest._t, _d, sizeof(_e->digest._t))

	switch (type) {
	case ARCHIVE_ENTRY_DIGEST_MD5:
		copy_digest(entry, md5, digest);
		break;
	case ARCHIVE_ENTRY_DIGEST_RMD160:
		copy_digest(entry, rmd160, digest);
		break;
	case ARCHIVE_ENTRY_DIGEST_SHA1:
		copy_digest(entry, sha1, digest);
		break;
	case ARCHIVE_ENTRY_DIGEST_SHA256:
		copy_digest(entry, sha256, digest);
		break;
	case ARCHIVE_ENTRY_DIGEST_SHA384:
		copy_digest(entry, sha384, digest);
		break;
	case ARCHIVE_ENTRY_DIGEST_SHA512:
		copy_digest(entry, sha512, digest);
		break;
	default:
		return ARCHIVE_WARN;
	}

	return ARCHIVE_OK;
#undef copy_digest
}